

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_SequenceApiTestWithScript_Test::TestBody
          (ConfidentialTransactionContext_SequenceApiTestWithScript_Test *this)

{
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Privkey> __l_00;
  initializer_list<cfd::UtxoData> __l_01;
  initializer_list<cfd::SignParameter> __l_02;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  reference pvVar5;
  char *lhs;
  AssertionResult gtest_ar;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> signatures;
  SignParameter sign1;
  SignParameter sign2;
  ByteData signature1;
  ByteData signature2;
  ByteData256 sighash;
  SigHashType sighash_type;
  OutPoint outpoint2;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  OutPoint outpoint1;
  ByteData tx;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext txc;
  Address asset_address;
  Address address;
  UtxoData utxo3;
  UtxoData utxo2;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> privkeys;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  UtxoData utxo1;
  ElementsAddressFactory factory;
  uint32_t in_stack_ffffffffffffce58;
  undefined4 uVar6;
  uint32_t in_stack_ffffffffffffce5c;
  UtxoData *in_stack_ffffffffffffce60;
  undefined1 in_stack_ffffffffffffce68;
  undefined1 in_stack_ffffffffffffce69;
  undefined1 in_stack_ffffffffffffce6a;
  undefined1 in_stack_ffffffffffffce6b;
  undefined1 in_stack_ffffffffffffce6c;
  undefined1 in_stack_ffffffffffffce6d;
  undefined1 in_stack_ffffffffffffce6e;
  undefined1 in_stack_ffffffffffffce6f;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_stack_ffffffffffffce70;
  OutPoint *in_stack_ffffffffffffce88;
  undefined4 in_stack_ffffffffffffce90;
  AddressType in_stack_ffffffffffffce94;
  undefined4 in_stack_ffffffffffffce98;
  undefined2 in_stack_ffffffffffffce9c;
  undefined1 in_stack_ffffffffffffce9e;
  undefined1 in_stack_ffffffffffffce9f;
  SignParameter *in_stack_ffffffffffffcea0;
  ConfidentialTransactionContext *this_00;
  ConfidentialTransactionContext *outpoint;
  ConfidentialAssetId *in_stack_ffffffffffffceb8;
  UtxoData *in_stack_ffffffffffffcec0;
  ConfidentialTransactionContext *this_01;
  undefined4 in_stack_ffffffffffffcec8;
  undefined1 in_stack_ffffffffffffcecc;
  undefined1 in_stack_ffffffffffffcecd;
  undefined1 in_stack_ffffffffffffcece;
  undefined1 in_stack_ffffffffffffcecf;
  UtxoData *in_stack_ffffffffffffced0;
  allocator *paVar7;
  Amount *in_stack_ffffffffffffcee8;
  SigHashType *in_stack_ffffffffffffcef0;
  Script *in_stack_ffffffffffffcef8;
  OutPoint *in_stack_ffffffffffffcf00;
  ConfidentialTransactionContext *in_stack_ffffffffffffcf08;
  SignParameter *in_stack_ffffffffffffcf18;
  WitnessVersion in_stack_ffffffffffffcf20;
  undefined4 in_stack_ffffffffffffcf24;
  undefined8 ****local_3088;
  Privkey *local_3030;
  Pubkey *local_2fe8;
  AssertHelper local_2f88;
  Message local_2f80;
  string local_2f78;
  AssertionResult local_2f58;
  AssertHelper local_2f48;
  Message local_2f40 [4];
  AssertHelper local_2f20;
  Message local_2f18;
  AssertHelper local_2f10;
  Message local_2f08;
  OutPoint local_2f00;
  AssertHelper local_2ed8;
  Message local_2ed0 [2];
  ConfidentialTransactionContext *local_2ec0;
  ConfidentialTransactionContext local_2eb8;
  undefined1 local_2dc8 [180];
  SigHashType local_2d14 [11];
  ByteData local_2c90;
  ByteData local_2c78;
  SigHashType local_2c5c;
  ByteData local_2c50;
  ByteData256 local_2c38;
  SigHashType local_2c1c;
  OutPoint *in_stack_ffffffffffffd3f8;
  ConfidentialTransactionContext *in_stack_ffffffffffffd400;
  undefined1 in_stack_ffffffffffffd40f;
  SigHashType *in_stack_ffffffffffffd410;
  AssertHelper in_stack_ffffffffffffd418;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffd420;
  AssertHelper in_stack_ffffffffffffd428;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffd430;
  ConstCharPtr local_2bb8;
  AssertHelper local_2bb0;
  Message local_2ba8 [2];
  SigHashType local_2b98;
  allocator local_2b89;
  string local_2b88;
  Privkey local_2b68;
  allocator local_2b41;
  string local_2b40;
  Pubkey local_2b20;
  byte local_2b01;
  ConstCharPtr local_2b00;
  OutPoint local_2af8;
  ByteData local_2ad0;
  AssertHelper local_2ab8;
  Message local_2ab0 [2];
  undefined1 ****local_2aa0;
  undefined8 ***local_2a98 [158];
  undefined1 local_25a8 [1264];
  undefined1 local_20b8 [1264];
  undefined1 ****local_1bc8;
  undefined8 local_1bc0;
  ConfidentialTransaction local_1ba0 [2];
  allocator local_1ae1;
  string local_1ae0 [415];
  allocator local_1941;
  string local_1940 [415];
  allocator local_17a1;
  string local_17a0;
  ConfidentialAssetId local_1780;
  Amount local_1758;
  allocator local_1741;
  string local_1740;
  Script local_1720;
  allocator local_16e1;
  string local_16e0;
  Txid local_16c0;
  undefined8 local_16a0;
  Txid local_1678;
  uint32_t local_1658;
  Script local_1650 [8];
  string local_1468 [32];
  Amount local_1448;
  undefined4 local_1438;
  undefined8 local_1430;
  ConfidentialAssetId local_1428 [15];
  allocator local_11a9;
  string local_11a8;
  ConfidentialAssetId local_1188;
  Amount local_1160;
  Script local_1150;
  Address local_1118;
  Script local_fa0;
  allocator local_f61;
  string local_f60;
  Txid local_f40;
  undefined8 local_f20;
  Txid local_ef8;
  uint32_t local_ed8;
  Script local_ed0;
  undefined1 local_e98 [432];
  string local_ce8 [32];
  int64_t local_cc8;
  undefined1 local_cc0;
  undefined4 local_cb8;
  undefined8 local_cb0;
  ConfidentialAssetId local_ca8 [15];
  undefined1 local_a2a;
  allocator local_a29;
  string local_a28;
  allocator local_a01;
  string local_a00;
  allocator local_9d9;
  string local_9d8;
  Privkey *local_9b8;
  Privkey local_9b0;
  Privkey local_990;
  Privkey local_970;
  undefined1 local_950 [46];
  undefined1 local_922;
  allocator local_921;
  string local_920;
  allocator local_8f9;
  string local_8f8;
  allocator local_8d1;
  string local_8d0;
  Pubkey *local_8b0;
  Pubkey local_8a8;
  Pubkey local_890;
  Pubkey local_878;
  undefined1 local_860 [47];
  allocator local_831;
  string local_830;
  ConfidentialAssetId local_810;
  Amount local_7e8;
  allocator local_7d1;
  string local_7d0 [32];
  Address local_7b0;
  allocator local_631;
  string local_630;
  Script local_610;
  allocator local_5d1;
  string local_5d0;
  Script local_5b0;
  allocator local_571;
  string local_570;
  Txid local_550;
  undefined8 local_520;
  Txid local_4f8;
  uint32_t local_4d8;
  Script local_4d0;
  Script local_498;
  Address local_460;
  string local_2e8 [32];
  int64_t local_2c8;
  undefined1 local_2c0;
  undefined4 local_2b8;
  undefined8 local_2b0;
  ConfidentialAssetId local_2a8 [17];
  
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)in_stack_ffffffffffffcea0,
             CONCAT13(in_stack_ffffffffffffce9f,
                      CONCAT12(in_stack_ffffffffffffce9e,in_stack_ffffffffffffce9c)));
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffcec0);
  local_520 = 0;
  local_2b0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_570,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,&local_571);
  cfd::core::Txid::Txid(&local_550,&local_570);
  cfd::core::Txid::operator=(&local_4f8,&local_550);
  cfd::core::Txid::~Txid((Txid *)0x2285b6);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  local_4d8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5d0,
             "0020a8417024154c9283738a8216def5e28991d3ba3f6d6f8feaecb684321eab02fc",&local_5d1);
  cfd::core::Script::Script(&local_5b0,&local_5d0);
  cfd::core::Script::operator=(&local_4d0,&local_5b0);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffce60);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_630,
             "210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bac",&local_631);
  cfd::core::Script::Script(&local_610,&local_630);
  cfd::core::Script::operator=(&local_498,&local_610);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffce60);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_7d0,"ert1q4pqhqfq4fjfgxuu2sgtdaa0z3xga8w3ld4hcl6hvk6zry84tqt7q2hlfn2",&local_7d1)
  ;
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)
             CONCAT17(in_stack_ffffffffffffce6f,
                      CONCAT16(in_stack_ffffffffffffce6e,
                               CONCAT15(in_stack_ffffffffffffce6d,
                                        CONCAT14(in_stack_ffffffffffffce6c,
                                                 CONCAT13(in_stack_ffffffffffffce6b,
                                                          CONCAT12(in_stack_ffffffffffffce6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffce69,
                                                  in_stack_ffffffffffffce68))))))),
             (string *)in_stack_ffffffffffffce60);
  cfd::core::Address::operator=(&local_460,&local_7b0);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffce60);
  std::__cxx11::string::~string(local_7d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
  std::__cxx11::string::operator=
            (local_2e8,"wsh(pk(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b))"
            );
  cfd::core::Amount::Amount(&local_7e8,10000000);
  local_2c0 = local_7e8.ignore_check_;
  local_2c8 = local_7e8.amount_;
  local_2b8 = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_830,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_831);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_810,&local_830);
  cfd::core::ConfidentialAssetId::operator=(local_2a8,&local_810);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x22883c);
  std::__cxx11::string::~string((string *)&local_830);
  std::allocator<char>::~allocator((allocator<char> *)&local_831);
  local_922 = 1;
  local_8b0 = &local_8a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_8d0,
             "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",&local_8d1);
  cfd::core::Pubkey::Pubkey(&local_8a8,&local_8d0);
  local_8b0 = &local_890;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_8f8,
             "020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281",&local_8f9);
  cfd::core::Pubkey::Pubkey(&local_890,&local_8f8);
  local_8b0 = &local_878;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_920,
             "03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae",&local_921);
  cfd::core::Pubkey::Pubkey(&local_878,&local_920);
  local_922 = 0;
  local_860._0_8_ = &local_8a8;
  local_860._8_8_ = (pointer)0x3;
  std::allocator<cfd::core::Pubkey>::allocator((allocator<cfd::core::Pubkey> *)0x2289b5);
  __l._M_array._4_2_ = in_stack_ffffffffffffce9c;
  __l._M_array._0_4_ = in_stack_ffffffffffffce98;
  __l._M_array._6_1_ = in_stack_ffffffffffffce9e;
  __l._M_array._7_1_ = in_stack_ffffffffffffce9f;
  __l._M_len = (size_type)in_stack_ffffffffffffcea0;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
             CONCAT44(in_stack_ffffffffffffce94,in_stack_ffffffffffffce90),__l,
             (allocator_type *)in_stack_ffffffffffffce88);
  std::allocator<cfd::core::Pubkey>::~allocator((allocator<cfd::core::Pubkey> *)0x2289e9);
  local_2fe8 = (Pubkey *)local_860;
  do {
    local_2fe8 = local_2fe8 + -1;
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x228a1e);
  } while (local_2fe8 != &local_8a8);
  std::__cxx11::string::~string((string *)&local_920);
  std::allocator<char>::~allocator((allocator<char> *)&local_921);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
  local_a2a = 1;
  local_9b8 = &local_9b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_9d8,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",&local_9d9)
  ;
  cfd::core::Privkey::FromWif(&local_9b0,&local_9d8,kTestnet,true);
  local_9b8 = &local_990;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a00,"cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt",&local_a01)
  ;
  cfd::core::Privkey::FromWif(&local_990,&local_a00,kTestnet,true);
  local_9b8 = &local_970;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a28,"cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9",&local_a29)
  ;
  cfd::core::Privkey::FromWif(&local_970,&local_a28,kTestnet,true);
  local_a2a = 0;
  local_950._0_8_ = &local_9b0;
  local_950._8_8_ = (pointer)0x3;
  std::allocator<cfd::core::Privkey>::allocator((allocator<cfd::core::Privkey> *)0x228bfd);
  __l_00._M_array._4_2_ = in_stack_ffffffffffffce9c;
  __l_00._M_array._0_4_ = in_stack_ffffffffffffce98;
  __l_00._M_array._6_1_ = in_stack_ffffffffffffce9e;
  __l_00._M_array._7_1_ = in_stack_ffffffffffffce9f;
  __l_00._M_len = (size_type)in_stack_ffffffffffffcea0;
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::vector
            ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
             CONCAT44(in_stack_ffffffffffffce94,in_stack_ffffffffffffce90),__l_00,
             (allocator_type *)in_stack_ffffffffffffce88);
  std::allocator<cfd::core::Privkey>::~allocator((allocator<cfd::core::Privkey> *)0x228c31);
  local_3030 = (Privkey *)local_950;
  do {
    local_3030 = local_3030 + -1;
    cfd::core::Privkey::~Privkey((Privkey *)0x228c66);
  } while (local_3030 != &local_9b0);
  std::__cxx11::string::~string((string *)&local_a28);
  std::allocator<char>::~allocator((allocator<char> *)&local_a29);
  std::__cxx11::string::~string((string *)&local_a00);
  std::allocator<char>::~allocator((allocator<char> *)&local_a01);
  std::__cxx11::string::~string((string *)&local_9d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffcec0);
  local_f20 = 0;
  local_cb0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f60,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,&local_f61);
  cfd::core::Txid::Txid(&local_f40,&local_f60);
  cfd::core::Txid::operator=(&local_ef8,&local_f40);
  cfd::core::Txid::~Txid((Txid *)0x228d66);
  std::__cxx11::string::~string((string *)&local_f60);
  std::allocator<char>::~allocator((allocator<char> *)&local_f61);
  local_ed8 = 1;
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            (&local_fa0,2,
             (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_860 + 0x10),
             true);
  cfd::core::Script::operator=((Script *)local_e98,&local_fa0);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffce60);
  cfd::AddressFactory::CreateP2shAddress
            ((AddressFactory *)
             CONCAT17(in_stack_ffffffffffffce6f,
                      CONCAT16(in_stack_ffffffffffffce6e,
                               CONCAT15(in_stack_ffffffffffffce6d,
                                        CONCAT14(in_stack_ffffffffffffce6c,
                                                 CONCAT13(in_stack_ffffffffffffce6b,
                                                          CONCAT12(in_stack_ffffffffffffce6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffce69,
                                                  in_stack_ffffffffffffce68))))))),
             (Script *)in_stack_ffffffffffffce60);
  cfd::core::Address::operator=((Address *)(local_e98 + 0x38),&local_1118);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffce60);
  cfd::core::Address::GetLockingScript(&local_1150,(Address *)(local_e98 + 0x38));
  cfd::core::Script::operator=(&local_ed0,&local_1150);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffce60);
  std::__cxx11::string::operator=
            (local_ce8,
             "sh(wsh(multi(2,0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27,020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281,03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae)))"
            );
  cfd::core::Amount::Amount(&local_1160,180000);
  local_cc0 = local_1160.ignore_check_;
  local_cc8 = local_1160.amount_;
  local_cb8 = 5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_11a8,
             "849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735",&local_11a9);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_1188,&local_11a8);
  cfd::core::ConfidentialAssetId::operator=(local_ca8,&local_1188);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x228f0f);
  std::__cxx11::string::~string((string *)&local_11a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11a9);
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffcec0);
  local_16a0 = 0;
  local_1430 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_16e0,
             "31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",&local_16e1);
  cfd::core::Txid::Txid(&local_16c0,&local_16e0);
  cfd::core::Txid::operator=(&local_1678,&local_16c0);
  cfd::core::Txid::~Txid((Txid *)0x228fbe);
  std::__cxx11::string::~string((string *)&local_16e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_16e1);
  local_1658 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1740,"51",&local_1741);
  cfd::core::Script::Script(&local_1720,&local_1740);
  cfd::core::Script::operator=(local_1650,&local_1720);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffce60);
  std::__cxx11::string::~string((string *)&local_1740);
  std::allocator<char>::~allocator((allocator<char> *)&local_1741);
  std::__cxx11::string::operator=(local_1468,"raw(51)");
  cfd::core::Amount::Amount(&local_1758,10000);
  local_1448.ignore_check_ = local_1758.ignore_check_;
  local_1448.amount_ = local_1758.amount_;
  local_1438 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_17a0,
             "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",&local_17a1);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_1780,&local_17a0);
  cfd::core::ConfidentialAssetId::operator=(local_1428,&local_1780);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x22912c);
  std::__cxx11::string::~string((string *)&local_17a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1940,"2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6",&local_1941);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)
             CONCAT17(in_stack_ffffffffffffce6f,
                      CONCAT16(in_stack_ffffffffffffce6e,
                               CONCAT15(in_stack_ffffffffffffce6d,
                                        CONCAT14(in_stack_ffffffffffffce6c,
                                                 CONCAT13(in_stack_ffffffffffffce6b,
                                                          CONCAT12(in_stack_ffffffffffffce6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffce69,
                                                  in_stack_ffffffffffffce68))))))),
             (string *)in_stack_ffffffffffffce60);
  std::__cxx11::string::~string(local_1940);
  std::allocator<char>::~allocator((allocator<char> *)&local_1941);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ae0,"2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z",&local_1ae1);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)
             CONCAT17(in_stack_ffffffffffffce6f,
                      CONCAT16(in_stack_ffffffffffffce6e,
                               CONCAT15(in_stack_ffffffffffffce6d,
                                        CONCAT14(in_stack_ffffffffffffce6c,
                                                 CONCAT13(in_stack_ffffffffffffce6b,
                                                          CONCAT12(in_stack_ffffffffffffce6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffce69,
                                                  in_stack_ffffffffffffce68))))))),
             (string *)in_stack_ffffffffffffce60);
  std::__cxx11::string::~string(local_1ae0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ae1);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_ffffffffffffce60,in_stack_ffffffffffffce5c,
             in_stack_ffffffffffffce58);
  local_2aa0 = (undefined1 ****)local_2a98;
  cfd::UtxoData::UtxoData
            (in_stack_ffffffffffffced0,
             (UtxoData *)
             CONCAT17(in_stack_ffffffffffffcecf,
                      CONCAT16(in_stack_ffffffffffffcece,
                               CONCAT15(in_stack_ffffffffffffcecd,
                                        CONCAT14(in_stack_ffffffffffffcecc,in_stack_ffffffffffffcec8
                                                )))));
  local_2aa0 = (undefined1 ****)local_25a8;
  cfd::UtxoData::UtxoData
            (in_stack_ffffffffffffced0,
             (UtxoData *)
             CONCAT17(in_stack_ffffffffffffcecf,
                      CONCAT16(in_stack_ffffffffffffcece,
                               CONCAT15(in_stack_ffffffffffffcecd,
                                        CONCAT14(in_stack_ffffffffffffcecc,in_stack_ffffffffffffcec8
                                                )))));
  local_2aa0 = (undefined1 ****)local_20b8;
  cfd::UtxoData::UtxoData
            (in_stack_ffffffffffffced0,
             (UtxoData *)
             CONCAT17(in_stack_ffffffffffffcecf,
                      CONCAT16(in_stack_ffffffffffffcece,
                               CONCAT15(in_stack_ffffffffffffcecd,
                                        CONCAT14(in_stack_ffffffffffffcecc,in_stack_ffffffffffffcec8
                                                )))));
  local_1bc8 = (undefined1 ****)local_2a98;
  local_1bc0 = 3;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x2292c2);
  __l_01._M_array._4_2_ = in_stack_ffffffffffffce9c;
  __l_01._M_array._0_4_ = in_stack_ffffffffffffce98;
  __l_01._M_array._6_1_ = in_stack_ffffffffffffce9e;
  __l_01._M_array._7_1_ = in_stack_ffffffffffffce9f;
  __l_01._M_len = (size_type)in_stack_ffffffffffffcea0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
             CONCAT44(in_stack_ffffffffffffce94,in_stack_ffffffffffffce90),__l_01,
             (allocator_type *)in_stack_ffffffffffffce88);
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x2292f6);
  local_3088 = &local_1bc8;
  do {
    local_3088 = local_3088 + -0x9e;
    cfd::UtxoData::~UtxoData(in_stack_ffffffffffffce60);
  } while (local_3088 != local_2a98);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::AddInputs
                ((ConfidentialTransactionContext *)
                 CONCAT44(in_stack_ffffffffffffce94,in_stack_ffffffffffffce90),
                 (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffce88)
      ;
    }
  }
  else {
    testing::Message::Message(local_2ab0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2ab8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x36f,
               "Expected: txc.AddInputs(utxos) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_2ab8,local_2ab0);
    testing::internal::AssertHelper::~AssertHelper(&local_2ab8);
    testing::Message::~Message((Message *)0x229e99);
  }
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ConfidentialTransactionContext *)in_stack_ffffffffffffced0,
             (Address *)
             CONCAT17(in_stack_ffffffffffffcecf,
                      CONCAT16(in_stack_ffffffffffffcece,
                               CONCAT15(in_stack_ffffffffffffcecd,
                                        CONCAT14(in_stack_ffffffffffffcecc,in_stack_ffffffffffffcec8
                                                )))),(Amount *)in_stack_ffffffffffffcec0,
             in_stack_ffffffffffffceb8);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ConfidentialTransactionContext *)in_stack_ffffffffffffced0,
             (Address *)
             CONCAT17(in_stack_ffffffffffffcecf,
                      CONCAT16(in_stack_ffffffffffffcece,
                               CONCAT15(in_stack_ffffffffffffcecd,
                                        CONCAT14(in_stack_ffffffffffffcecc,in_stack_ffffffffffffcec8
                                                )))),(Amount *)in_stack_ffffffffffffcec0,
             in_stack_ffffffffffffceb8);
  cfd::core::ConfidentialTransaction::AddTxOutFee(local_1ba0,&local_1448,local_1428);
  cfd::core::ByteData::ByteData(&local_2ad0);
  cfd::core::OutPoint::OutPoint(&local_2af8,&local_4f8,local_4d8);
  testing::internal::ConstCharPtr::ConstCharPtr(&local_2b00,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_2b00);
  if (bVar1) {
    local_2b01 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2b40,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",&local_2b41);
      cfd::core::Pubkey::Pubkey(&local_2b20,&local_2b40);
      paVar7 = &local_2b89;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2b88,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",paVar7
                );
      cfd::core::Privkey::FromWif(&local_2b68,&local_2b88,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2b98);
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)in_stack_ffffffffffffd430.ptr_,
                 (OutPoint *)in_stack_ffffffffffffd428.data_,
                 (Pubkey *)in_stack_ffffffffffffd420.ptr_,(Privkey *)in_stack_ffffffffffffd418.data_
                 ,in_stack_ffffffffffffd410,(bool)in_stack_ffffffffffffd40f);
      cfd::core::Privkey::~Privkey((Privkey *)0x22a0c6);
      std::__cxx11::string::~string((string *)&local_2b88);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b89);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x22a0ed);
      std::__cxx11::string::~string((string *)&local_2b40);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b41);
    }
    if ((local_2b01 & 1) != 0) goto LAB_0022a351;
    local_2b00.value =
         "Expected: txc.SignWithKey(outpoint1, Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_2ba8);
  testing::internal::AssertHelper::AssertHelper
            (&local_2bb0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
             ,0x37c,local_2b00.value);
  testing::internal::AssertHelper::operator=(&local_2bb0,local_2ba8);
  testing::internal::AssertHelper::~AssertHelper(&local_2bb0);
  testing::Message::~Message((Message *)0x22a306);
LAB_0022a351:
  testing::internal::ConstCharPtr::ConstCharPtr(&local_2bb8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_2bb8);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Verify
                (in_stack_ffffffffffffd400,in_stack_ffffffffffffd3f8);
    }
    local_2bb8.value =
         "Expected: txc.Verify(outpoint1) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message((Message *)&stack0xffffffffffffd430);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&stack0xffffffffffffd428,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
             ,0x37e,local_2bb8.value);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&stack0xffffffffffffd428,(Message *)&stack0xffffffffffffd430);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffd428);
  testing::Message::~Message((Message *)0x22a4c9);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::IgnoreVerify
                ((ConfidentialTransactionContext *)
                 CONCAT44(in_stack_ffffffffffffce94,in_stack_ffffffffffffce90),
                 in_stack_ffffffffffffce88);
    }
  }
  else {
    testing::Message::Message((Message *)&stack0xffffffffffffd420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffd418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x37f,
               "Expected: txc.IgnoreVerify(outpoint1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffd418,(Message *)&stack0xffffffffffffd420);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffd418);
    testing::Message::~Message((Message *)0x22a5fc);
  }
  cfd::core::OutPoint::OutPoint((OutPoint *)&stack0xffffffffffffd3f0,&local_ef8,local_ed8);
  cfd::core::SigHashType::SigHashType(&local_2c1c);
  this_01 = (ConfidentialTransactionContext *)local_e98;
  cfd::core::SigHashType::SigHashType(&local_2c5c,&local_2c1c);
  uVar6 = 0;
  cfd::ConfidentialTransactionContext::CreateSignatureHash
            (in_stack_ffffffffffffcf08,in_stack_ffffffffffffcf00,in_stack_ffffffffffffcef8,
             in_stack_ffffffffffffcef0,in_stack_ffffffffffffcee8,in_stack_ffffffffffffcf20);
  cfd::core::ByteData256::ByteData256(&local_2c38,&local_2c50);
  cfd::core::ByteData::~ByteData((ByteData *)0x22a6f9);
  pvVar5 = std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::operator[]
                     ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
                      (local_950 + 0x10),2);
  cfd::core::SignatureUtil::CalculateEcSignature(&local_2c78,&local_2c38,pvVar5,true);
  pvVar5 = std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::operator[]
                     ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
                      (local_950 + 0x10),1);
  cfd::core::SignatureUtil::CalculateEcSignature(&local_2c90,&local_2c38,pvVar5,true);
  cfd::core::SigHashType::SigHashType(local_2d14,&local_2c1c);
  cfd::SignParameter::SignParameter
            (in_stack_ffffffffffffcea0,
             (ByteData *)
             CONCAT17(in_stack_ffffffffffffce9f,
                      CONCAT16(in_stack_ffffffffffffce9e,
                               CONCAT24(in_stack_ffffffffffffce9c,in_stack_ffffffffffffce98))),
             SUB41(in_stack_ffffffffffffce94 >> 0x18,0),(SigHashType *)in_stack_ffffffffffffce88);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_860 + 0x10),2);
  cfd::SignParameter::SetRelatedPubkey
            ((SignParameter *)in_stack_ffffffffffffce60,
             (Pubkey *)CONCAT44(in_stack_ffffffffffffce5c,uVar6));
  cfd::core::SigHashType::SigHashType((SigHashType *)(local_2dc8 + 0x2c),&local_2c1c);
  cfd::SignParameter::SignParameter
            (in_stack_ffffffffffffcea0,
             (ByteData *)
             CONCAT17(in_stack_ffffffffffffce9f,
                      CONCAT16(in_stack_ffffffffffffce9e,
                               CONCAT24(in_stack_ffffffffffffce9c,in_stack_ffffffffffffce98))),
             SUB41(in_stack_ffffffffffffce94 >> 0x18,0),(SigHashType *)in_stack_ffffffffffffce88);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_860 + 0x10),1);
  cfd::SignParameter::SetRelatedPubkey
            ((SignParameter *)in_stack_ffffffffffffce60,
             (Pubkey *)CONCAT44(in_stack_ffffffffffffce5c,uVar6));
  local_2ec0 = &local_2eb8;
  cfd::SignParameter::SignParameter
            ((SignParameter *)CONCAT44(in_stack_ffffffffffffcf24,in_stack_ffffffffffffcf20),
             in_stack_ffffffffffffcf18);
  local_2ec0 = (ConfidentialTransactionContext *)
               ((long)&local_2eb8.signed_map_._M_t._M_impl.super__Rb_tree_header._M_header + 0x18);
  cfd::SignParameter::SignParameter
            ((SignParameter *)CONCAT44(in_stack_ffffffffffffcf24,in_stack_ffffffffffffcf20),
             in_stack_ffffffffffffcf18);
  local_2dc8._0_8_ = &local_2eb8;
  local_2dc8._8_8_ = (void *)0x2;
  std::allocator<cfd::SignParameter>::allocator((allocator<cfd::SignParameter> *)0x22a885);
  __l_02._M_array._4_2_ = in_stack_ffffffffffffce9c;
  __l_02._M_array._0_4_ = in_stack_ffffffffffffce98;
  __l_02._M_array._6_1_ = in_stack_ffffffffffffce9e;
  __l_02._M_array._7_1_ = in_stack_ffffffffffffce9f;
  __l_02._M_len = (size_type)in_stack_ffffffffffffcea0;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
             CONCAT44(in_stack_ffffffffffffce94,in_stack_ffffffffffffce90),__l_02,
             (allocator_type *)in_stack_ffffffffffffce88);
  std::allocator<cfd::SignParameter>::~allocator((allocator<cfd::SignParameter> *)0x22a8b6);
  outpoint = &local_2eb8;
  this_00 = (ConfidentialTransactionContext *)local_2dc8;
  do {
    this_00 = (ConfidentialTransactionContext *)&this_00[-1].utxo_map_;
    cfd::SignParameter::~SignParameter((SignParameter *)in_stack_ffffffffffffce60);
  } while (this_00 != outpoint);
  cfd::ConfidentialTransactionContext::AddMultisigSign
            (this_00,(OutPoint *)outpoint,
             (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)this_00,
             (Script *)
             CONCAT17(in_stack_ffffffffffffce9f,
                      CONCAT16(in_stack_ffffffffffffce9e,
                               CONCAT24(in_stack_ffffffffffffce9c,in_stack_ffffffffffffce98))),
             in_stack_ffffffffffffce94);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Verify
                (in_stack_ffffffffffffd400,in_stack_ffffffffffffd3f8);
    }
  }
  else {
    testing::Message::Message(local_2ed0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2ed8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x38f,
               "Expected: txc.Verify(outpoint2) doesn\'t throw an exception.\n  Actual: it throws.")
    ;
    testing::internal::AssertHelper::operator=(&local_2ed8,local_2ed0);
    testing::internal::AssertHelper::~AssertHelper(&local_2ed8);
    testing::Message::~Message((Message *)0x22abac);
  }
  uVar2 = testing::internal::AlwaysTrue();
  if ((bool)uVar2) {
    in_stack_ffffffffffffce6e = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffce6e) {
      cfd::core::OutPoint::OutPoint(&local_2f00,&local_1678,local_1658);
      cfd::ConfidentialTransactionContext::Verify
                (in_stack_ffffffffffffd400,in_stack_ffffffffffffd3f8);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x22ac69);
    }
  }
  else {
    testing::Message::Message(&local_2f08);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x392,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2f10,&local_2f08);
    testing::internal::AssertHelper::~AssertHelper(&local_2f10);
    testing::Message::~Message((Message *)0x22ad33);
  }
  uVar3 = testing::internal::AlwaysTrue();
  if ((bool)uVar3) {
    in_stack_ffffffffffffce6c = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffce6c) {
      cfd::ConfidentialTransactionContext::Verify(this_01);
    }
  }
  else {
    testing::Message::Message(&local_2f18);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x394,"Expected: txc.Verify() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_2f20,&local_2f18);
    testing::internal::AssertHelper::~AssertHelper(&local_2f20);
    testing::Message::~Message((Message *)0x22ae5e);
  }
  uVar4 = testing::internal::AlwaysTrue();
  if ((bool)uVar4) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize
                ((ConfidentialTransactionContext *)
                 CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffce6e,
                                         CONCAT15(uVar3,CONCAT14(in_stack_ffffffffffffce6c,
                                                                 CONCAT13(uVar4,CONCAT12(bVar1,
                                                  CONCAT11(in_stack_ffffffffffffce69,
                                                           in_stack_ffffffffffffce68))))))));
      cfd::core::ByteData::operator=
                ((ByteData *)in_stack_ffffffffffffce60,
                 (ByteData *)CONCAT44(in_stack_ffffffffffffce5c,uVar6));
      cfd::core::ByteData::~ByteData((ByteData *)0x22af0f);
    }
  }
  else {
    testing::Message::Message(local_2f40);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x396,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_2f48,local_2f40);
    testing::internal::AssertHelper::~AssertHelper(&local_2f48);
    testing::Message::~Message((Message *)0x22afb6);
  }
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_2f78,&local_2ad0);
  lhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2f58,"tx.GetHex().c_str()",
             "\"020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000989680001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000002bf20001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000000000000000040047304402207c0af1ed61b4d0f1969207c508587bdbbdc9132a7d9c9ca594f191a50ab9c70102201d1906422cdf8862eb8ff0c1952c151c27d53f090e5248245e7f3a3e77c27ac90147304402207aeb8b43254a3b95bdb82911d8d598896ef3926411ea4bd28a3a15f29a0bb789022073c62e7c336a2fabd80bdc896a9ecd5e139f5a13b71f7f4a58f8822741b5621b016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000000000000000\""
             ,lhs,
             "020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000989680001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000002bf20001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000000000000000040047304402207c0af1ed61b4d0f1969207c508587bdbbdc9132a7d9c9ca594f191a50ab9c70102201d1906422cdf8862eb8ff0c1952c151c27d53f090e5248245e7f3a3e77c27ac90147304402207aeb8b43254a3b95bdb82911d8d598896ef3926411ea4bd28a3a15f29a0bb789022073c62e7c336a2fabd80bdc896a9ecd5e139f5a13b71f7f4a58f8822741b5621b016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000000000000000"
            );
  std::__cxx11::string::~string((string *)&local_2f78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f58);
  if (!bVar1) {
    testing::Message::Message(&local_2f80);
    in_stack_ffffffffffffce60 =
         (UtxoData *)testing::AssertionResult::failure_message((AssertionResult *)0x22b0d6);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x397,(char *)in_stack_ffffffffffffce60);
    testing::internal::AssertHelper::operator=(&local_2f88,&local_2f80);
    testing::internal::AssertHelper::~AssertHelper(&local_2f88);
    testing::Message::~Message((Message *)0x22b133);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x22b18b);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
            (in_stack_ffffffffffffce70);
  cfd::SignParameter::~SignParameter((SignParameter *)in_stack_ffffffffffffce60);
  cfd::SignParameter::~SignParameter((SignParameter *)in_stack_ffffffffffffce60);
  cfd::core::ByteData::~ByteData((ByteData *)0x22b1bf);
  cfd::core::ByteData::~ByteData((ByteData *)0x22b1cc);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x22b1d9);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x22b1e6);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x22b1f3);
  cfd::core::ByteData::~ByteData((ByteData *)0x22b200);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffce70);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_ffffffffffffce60);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffce60);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffce60);
  cfd::UtxoData::~UtxoData(in_stack_ffffffffffffce60);
  cfd::UtxoData::~UtxoData(in_stack_ffffffffffffce60);
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::~vector
            ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
             in_stack_ffffffffffffce70);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
             in_stack_ffffffffffffce70);
  cfd::UtxoData::~UtxoData(in_stack_ffffffffffffce60);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x22b282);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, SequenceApiTestWithScript)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1 (p2wsh on p2pk)
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("0020a8417024154c9283738a8216def5e28991d3ba3f6d6f8feaecb684321eab02fc");
  utxo1.redeem_script = Script("210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bac");
  utxo1.address = factory.GetAddress("ert1q4pqhqfq4fjfgxuu2sgtdaa0z3xga8w3ld4hcl6hvk6zry84tqt7q2hlfn2");
  utxo1.descriptor = "wsh(pk(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b))";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2wshAddress;
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  // Address2 (2 of 3 multisig)
  // pubkey1: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey1: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  // pubkey2: '020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281',
  // privkey2: 'cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt'
  // pubkey3: '03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae',
  // privkey3: 'cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9'
  std::vector<Pubkey> pubkeys = {
    Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
    Pubkey("020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281"),
    Pubkey("03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae")
  };
  std::vector<Privkey> privkeys = {
    Privkey::FromWif("cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet),
    Privkey::FromWif("cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt", NetType::kTestnet),
    Privkey::FromWif("cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9", NetType::kTestnet)
  };
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 1;
  utxo2.redeem_script = ScriptUtil::CreateMultisigRedeemScript(2, pubkeys);
  utxo2.address = factory.CreateP2shAddress(utxo2.redeem_script);
  utxo2.locking_script = utxo2.address.GetLockingScript();
  utxo2.descriptor = "sh(wsh(multi(2,0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27,020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281,03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae)))";
  utxo2.amount = Amount(int64_t{180000});
  utxo2.address_type = AddressType::kP2shP2wshAddress;
  utxo2.asset = ConfidentialAssetId("849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735");

  // Address3 (OP_TRUE)
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo3.vout = 2;
  utxo3.locking_script = Script("51");
  // utxo3.address;
  utxo3.descriptor = "raw(51)";
  utxo3.amount = Amount(int64_t{10000});
  utxo3.address_type = AddressType::kP2shAddress;
  utxo3.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address = factory.GetAddress("2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6");
  // "2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z"
  Address asset_address = factory.GetAddress("2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z");

  ConfidentialTransactionContext txc(2, 0);
  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  EXPECT_NO_THROW(txc.AddInputs(utxos));
  txc.AddTxOut(address, utxo1.amount, utxo1.asset);
  txc.AddTxOut(asset_address, utxo2.amount, utxo2.asset);
  txc.AddTxOutFee(utxo3.amount, utxo3.asset);

  ByteData tx;

  // sign1 -> fail -> ignore
  OutPoint outpoint1(utxo1.txid, utxo1.vout);
  EXPECT_THROW(txc.SignWithKey(outpoint1,
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)),
      CfdException);

  EXPECT_THROW(txc.Verify(outpoint1), CfdException);
  EXPECT_NO_THROW(txc.IgnoreVerify(outpoint1));

  // sign2 -> manual -> success
  OutPoint outpoint2(utxo2.txid, utxo2.vout);
  SigHashType sighash_type;
  ByteData256 sighash = ByteData256(txc.CreateSignatureHash(outpoint2,
      utxo2.redeem_script, sighash_type, utxo2.amount, WitnessVersion::kVersion0));
  ByteData signature2 = SignatureUtil::CalculateEcSignature(sighash, privkeys[2]);
  ByteData signature1 = SignatureUtil::CalculateEcSignature(sighash, privkeys[1]);
  SignParameter sign2(signature2, true, sighash_type);
  sign2.SetRelatedPubkey(pubkeys[2]);
  SignParameter sign1(signature1, true, sighash_type);
  sign1.SetRelatedPubkey(pubkeys[1]);
  std::vector<SignParameter> signatures = {sign2, sign1};
  txc.AddMultisigSign(
      outpoint2, signatures, utxo2.redeem_script, utxo2.address_type);
  EXPECT_NO_THROW(txc.Verify(outpoint2));

  // sign3 -> ok
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(txc.Verify());

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_STREQ(tx.GetHex().c_str(), "020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000989680001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000002bf20001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000000000000000040047304402207c0af1ed61b4d0f1969207c508587bdbbdc9132a7d9c9ca594f191a50ab9c70102201d1906422cdf8862eb8ff0c1952c151c27d53f090e5248245e7f3a3e77c27ac90147304402207aeb8b43254a3b95bdb82911d8d598896ef3926411ea4bd28a3a15f29a0bb789022073c62e7c336a2fabd80bdc896a9ecd5e139f5a13b71f7f4a58f8822741b5621b016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000000000000000");
}